

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoopSwitch<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThanEquals,false,false>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  idx_t iVar6;
  ulong uVar7;
  ulong uVar8;
  sel_t sVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (false_sel == (SelectionVector *)0x0 || true_sel == (SelectionVector *)0x0) {
    if (true_sel == (SelectionVector *)0x0) {
      iVar6 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThanEquals,false,false,false,true>
                        (ldata,rdata,sel,count,mask,(SelectionVector *)0x0,false_sel);
      return iVar6;
    }
    if (count + 0x3f < 0x40) {
      iVar6 = 0;
    }
    else {
      puVar1 = (mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      iVar6 = 0;
      uVar13 = 0;
      uVar14 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar8 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar8 = count;
          }
LAB_0043f9b6:
          uVar7 = uVar14;
          if (uVar14 < uVar8) {
            psVar2 = sel->sel_vector;
            psVar3 = true_sel->sel_vector;
            uVar12 = uVar14 << 4 | 8;
            do {
              uVar7 = uVar14;
              if (psVar2 != (sel_t *)0x0) {
                uVar7 = (ulong)psVar2[uVar14];
              }
              uVar10 = *(ulong *)((long)rdata + (uVar12 - 8));
              lVar4 = *(long *)((long)&rdata->lower + uVar12);
              lVar5 = *(long *)((long)&ldata->lower + uVar12);
              uVar11 = *(ulong *)((long)ldata + (uVar12 - 8));
              psVar3[iVar6] = (sel_t)uVar7;
              iVar6 = iVar6 + ((uVar10 <= uVar11 || lVar4 != lVar5) && lVar4 <= lVar5);
              uVar14 = uVar14 + 1;
              uVar12 = uVar12 + 0x10;
              uVar7 = uVar8;
            } while (uVar8 != uVar14);
          }
        }
        else {
          uVar12 = puVar1[uVar13];
          uVar8 = uVar14 + 0x40;
          if (count <= uVar14 + 0x40) {
            uVar8 = count;
          }
          uVar7 = uVar8;
          if (uVar12 != 0) {
            if (uVar12 == 0xffffffffffffffff) goto LAB_0043f9b6;
            uVar7 = uVar14;
            if (uVar14 < uVar8) {
              psVar2 = sel->sel_vector;
              psVar3 = true_sel->sel_vector;
              uVar11 = uVar14 << 4 | 8;
              uVar10 = 0;
              do {
                if (psVar2 == (sel_t *)0x0) {
                  sVar9 = (int)uVar14 + (int)uVar10;
                }
                else {
                  sVar9 = psVar2[uVar14 + uVar10];
                }
                if ((uVar12 >> (uVar10 & 0x3f) & 1) == 0) {
                  uVar7 = 0;
                }
                else {
                  lVar4 = *(long *)((long)&rdata->lower + uVar11);
                  lVar5 = *(long *)((long)&ldata->lower + uVar11);
                  uVar7 = (ulong)((*(ulong *)((long)rdata + (uVar11 - 8)) <=
                                   *(ulong *)((long)ldata + (uVar11 - 8)) || lVar4 != lVar5) &&
                                 lVar4 <= lVar5);
                }
                psVar3[iVar6] = sVar9;
                iVar6 = iVar6 + uVar7;
                uVar10 = uVar10 + 1;
                uVar11 = uVar11 + 0x10;
                uVar7 = uVar8;
              } while ((uVar14 - uVar8) + uVar10 != 0);
            }
          }
        }
        uVar13 = uVar13 + 1;
        uVar14 = uVar7;
      } while (uVar13 != count + 0x3f >> 6);
    }
  }
  else {
    iVar6 = SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThanEquals,false,false,true,true>
                      (ldata,rdata,sel,count,mask,true_sel,false_sel);
  }
  return iVar6;
}

Assistant:

static inline idx_t SelectFlatLoopSwitch(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                         const SelectionVector *sel, idx_t count, ValidityMask &mask,
	                                         SelectionVector *true_sel, SelectionVector *false_sel) {
		if (true_sel && false_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else if (true_sel) {
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, true, false>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		} else {
			D_ASSERT(false_sel);
			return SelectFlatLoop<LEFT_TYPE, RIGHT_TYPE, OP, LEFT_CONSTANT, RIGHT_CONSTANT, false, true>(
			    ldata, rdata, sel, count, mask, true_sel, false_sel);
		}
	}